

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  cpp_dec_float<200u,int,void> *this_00;
  Type TVar1;
  int iVar2;
  int32_t iVar3;
  pointer pnVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SPxId *pSVar6;
  pointer pnVar7;
  fpclass_type *pfVar8;
  pointer pnVar9;
  type_conflict5 tVar10;
  int iVar11;
  int iVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar17;
  byte bVar18;
  pointer pnVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  pointer pnVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar23;
  cpp_dec_float<200u,int,void> *pcVar24;
  uint *puVar25;
  uint *puVar26;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar27;
  cpp_dec_float<200U,_int,_void> *pcVar28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar30;
  fpclass_type fVar31;
  int *piVar32;
  int *piVar33;
  bool bVar34;
  byte bVar35;
  ulong uVar36;
  long local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_428;
  long local_410;
  cpp_dec_float<200U,_int,_void> local_3f8;
  pointer local_370;
  fpclass_type *local_368;
  pointer local_360;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<200U,_int,_void> local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  cpp_dec_float<200U,_int,_void> local_238;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar35 = 0;
  local_3f8.fpclass = cpp_dec_float_finite;
  local_3f8.prec_elem = 0x1c;
  local_3f8.data._M_elems[0] = 0;
  local_3f8.data._M_elems[1] = 0;
  local_3f8.data._M_elems[2] = 0;
  local_3f8.data._M_elems[3] = 0;
  local_3f8.data._M_elems[4] = 0;
  local_3f8.data._M_elems[5] = 0;
  local_3f8.data._M_elems[6] = 0;
  local_3f8.data._M_elems[7] = 0;
  local_3f8.data._M_elems[8] = 0;
  local_3f8.data._M_elems[9] = 0;
  local_3f8.data._M_elems[10] = 0;
  local_3f8.data._M_elems[0xb] = 0;
  local_3f8.data._M_elems[0xc] = 0;
  local_3f8.data._M_elems[0xd] = 0;
  local_3f8.data._M_elems[0xe] = 0;
  local_3f8.data._M_elems[0xf] = 0;
  local_3f8.data._M_elems[0x10] = 0;
  local_3f8.data._M_elems[0x11] = 0;
  local_3f8.data._M_elems[0x12] = 0;
  local_3f8.data._M_elems[0x13] = 0;
  local_3f8.data._M_elems[0x18] = 0;
  local_3f8.data._M_elems[0x19] = 0;
  local_3f8.data._M_elems._104_5_ = 0;
  local_3f8.data._M_elems[0x1b]._1_3_ = 0;
  local_3f8.exp = 0;
  local_3f8.neg = false;
  local_3f8.data._M_elems[0x14] = 0;
  local_3f8.data._M_elems[0x15] = 0;
  local_3f8.data._M_elems[0x16] = 0;
  local_3f8.data._M_elems[0x17] = 0;
  local_238.fpclass = cpp_dec_float_finite;
  local_238.prec_elem = 0x1c;
  local_238.data._M_elems[0] = 0;
  local_238.data._M_elems[1] = 0;
  local_238.data._M_elems[2] = 0;
  local_238.data._M_elems[3] = 0;
  local_238.data._M_elems[4] = 0;
  local_238.data._M_elems[5] = 0;
  local_238.data._M_elems[6] = 0;
  local_238.data._M_elems[7] = 0;
  local_238.data._M_elems[8] = 0;
  local_238.data._M_elems[9] = 0;
  local_238.data._M_elems[10] = 0;
  local_238.data._M_elems[0xb] = 0;
  local_238.data._M_elems[0xc] = 0;
  local_238.data._M_elems[0xd] = 0;
  local_238.data._M_elems[0xe] = 0;
  local_238.data._M_elems[0xf] = 0;
  local_238.data._M_elems[0x10] = 0;
  local_238.data._M_elems[0x11] = 0;
  local_238.data._M_elems[0x12] = 0;
  local_238.data._M_elems[0x13] = 0;
  local_238.data._M_elems[0x14] = 0;
  local_238.data._M_elems[0x15] = 0;
  local_238.data._M_elems[0x16] = 0;
  local_238.data._M_elems[0x17] = 0;
  local_238.data._M_elems[0x18] = 0;
  local_238.data._M_elems[0x19] = 0;
  local_238.data._M_elems._104_5_ = 0;
  local_238.data._M_elems[0x1b]._1_3_ = 0;
  local_238.exp = 0;
  local_238.neg = false;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 0x1c;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems[6] = 0;
  local_1b8.data._M_elems[7] = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.data._M_elems[10] = 0;
  local_1b8.data._M_elems[0xb] = 0;
  local_1b8.data._M_elems[0xc] = 0;
  local_1b8.data._M_elems[0xd] = 0;
  local_1b8.data._M_elems[0xe] = 0;
  local_1b8.data._M_elems[0xf] = 0;
  local_1b8.data._M_elems[0x18] = 0;
  local_1b8.data._M_elems[0x19] = 0;
  local_1b8.data._M_elems._104_5_ = 0;
  local_1b8.data._M_elems[0x1b]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  local_1b8.data._M_elems[0x10] = 0;
  local_1b8.data._M_elems[0x11] = 0;
  local_1b8.data._M_elems[0x12] = 0;
  local_1b8.data._M_elems[0x13] = 0;
  local_1b8.data._M_elems[0x14] = 0;
  local_1b8.data._M_elems[0x15] = 0;
  local_1b8.data._M_elems[0x16] = 0;
  local_1b8.data._M_elems[0x17] = 0;
  TVar1 = (this->
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_type;
  if (TVar1 == LEAVE) {
    bVar34 = false;
  }
  else {
    bVar34 = ((this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->theRep == ROW;
  }
  lVar15 = 0x1c;
  puVar25 = (uint *)maxabs;
  pcVar28 = &local_2c0;
  for (lVar14 = lVar15; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pcVar28->data)._M_elems[0] = *puVar25;
    puVar25 = puVar25 + 1;
    pcVar28 = (cpp_dec_float<200U,_int,_void> *)((pcVar28->data)._M_elems + 1);
  }
  local_2c0.exp = (maxabs->m_backend).exp;
  local_2c0.neg = (maxabs->m_backend).neg;
  local_240 = maxabs;
  local_2c0.fpclass = (maxabs->m_backend).fpclass;
  local_2c0.prec_elem = (maxabs->m_backend).prec_elem;
  pnVar4 = (upBound->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_368 = (fpclass_type *)
              (lowBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pnVar22 = (update->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  piVar32 = (update->thedelta).super_IdxSet.idx;
  pnVar19 = (update->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar25 = (uint *)val;
  puVar26 = (uint *)&local_b0;
  for (; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar26 = *puVar25;
    puVar25 = puVar25 + 1;
    puVar26 = puVar26 + 1;
  }
  local_b0.m_backend.exp = (val->m_backend).exp;
  local_b0.m_backend.neg = (val->m_backend).neg;
  local_b0.m_backend.fpclass = (val->m_backend).fpclass;
  local_b0.m_backend.prec_elem = (val->m_backend).prec_elem;
  local_370 = pnVar22;
  local_360 = pnVar19;
  if ((update->thedelta).setupStatus == true) {
    iVar12 = (update->thedelta).super_IdxSet.num;
    pnVar29 = &this->fastDelta;
    local_428 = -1;
    for (piVar33 = piVar32 + start; lVar15 = 0x1c, piVar33 < piVar32 + iVar12;
        piVar33 = piVar33 + incr) {
      iVar2 = *piVar33;
      if (TVar1 == LEAVE) {
        pSVar5 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        if (this->iscoid == true) {
          pDVar17 = (pSVar5->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.costat;
        }
        else {
          pDVar17 = (pSVar5->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.stat;
        }
        if (pSVar5->theRep * pDVar17->data[iVar2] < 1) goto LAB_004500ed;
      }
      else {
LAB_004500ed:
        if (bVar34) {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar6 = (pSVar5->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar6[iVar2].super_DataKey.info) {
            SPxColId::SPxColId((SPxColId *)&result,pSVar6 + iVar2);
            iVar11 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)&result);
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar11] == P_FIXED) goto LAB_004509b8;
          }
        }
        pnVar22 = pnVar19 + iVar2;
        pcVar28 = &local_3f8;
        for (lVar14 = lVar15; lVar14 != 0; lVar14 = lVar14 + -1) {
          (((cpp_dec_float<200U,_int,_void> *)&pcVar28->data)->data)._M_elems[0] =
               (pnVar22->m_backend).data._M_elems[0];
          pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4)
          ;
        }
        local_3f8.exp = pnVar19[iVar2].m_backend.exp;
        local_3f8.neg = pnVar19[iVar2].m_backend.neg;
        local_3f8.fpclass = pnVar19[iVar2].m_backend.fpclass;
        local_3f8.prec_elem = pnVar19[iVar2].m_backend.prec_elem;
        pcVar28 = &result.m_backend;
        pnVar23 = &this->epsilon;
        pcVar21 = pcVar28;
        for (lVar14 = lVar15; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar21->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + (ulong)bVar35 * -8 + 4);
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4);
        }
        result.m_backend.exp = (this->epsilon).m_backend.exp;
        result.m_backend.neg = (this->epsilon).m_backend.neg;
        result.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
        tVar10 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_3f8,
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)pcVar28);
        pnVar23 = &this->epsilon;
        if (tVar10) {
          pcVar21 = &local_2c0;
          tVar10 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_3f8,
                              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar21);
          lVar14 = lVar15;
          pcVar20 = pcVar21;
          if (tVar10) {
            pcVar20 = &local_3f8;
          }
          for (; lVar14 != 0; lVar14 = lVar14 + -1) {
            (((cpp_dec_float<200U,_int,_void> *)&pcVar21->data)->data)._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar20->data)->data)._M_elems[0];
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar20 + ((ulong)bVar35 * -2 + 1) * 4);
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar21 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          pcVar21 = &local_2c0;
          if (tVar10) {
            pcVar21 = &local_3f8;
          }
          local_2c0.exp = pcVar21->exp;
          pcVar21 = &local_2c0;
          if (tVar10) {
            pcVar21 = &local_3f8;
          }
          local_2c0.neg = pcVar21->neg;
          uVar36 = CONCAT44((int)((uint)tVar10 << 0x1f) >> 0x1f,(int)((uint)tVar10 << 0x1f) >> 0x1f)
          ;
          local_2c0._120_8_ = ~uVar36 & local_2c0._120_8_ | local_3f8._120_8_ & uVar36;
          pnVar22 = pnVar4 + iVar2;
          pcVar21 = &local_138;
          for (lVar14 = lVar15; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar21->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
            pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4);
          }
          local_138.exp = pnVar4[iVar2].m_backend.exp;
          local_138.neg = pnVar4[iVar2].m_backend.neg;
          local_138.fpclass = pnVar4[iVar2].m_backend.fpclass;
          local_138.prec_elem = pnVar4[iVar2].m_backend.prec_elem;
          pdVar13 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (pcVar28,*pdVar13,(type *)0x0);
          tVar10 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_138,
                              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar28);
          pnVar19 = local_360;
          if (tVar10) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (pcVar28,&local_138,&local_370[iVar2].m_backend);
            pcVar21 = pcVar28;
            pcVar20 = &local_238;
            for (lVar14 = lVar15; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar20->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar35 * -8 + 4);
            }
            local_238.exp = result.m_backend.exp;
            local_238.neg = result.m_backend.neg;
            local_238.fpclass = result.m_backend.fpclass;
            local_238.prec_elem = result.m_backend.prec_elem;
            result.m_backend.data._M_elems._0_8_ =
                 result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar10 = boost::multiprecision::operator<=
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_238,(int *)pcVar28);
            pnVar19 = local_360;
            pcVar21 = &pnVar29->m_backend;
            if (!tVar10) {
              result_2.m_backend.fpclass = cpp_dec_float_finite;
              result_2.m_backend.prec_elem = 0x1c;
              result_2.m_backend.data._M_elems[0] = 0;
              result_2.m_backend.data._M_elems[1] = 0;
              result_2.m_backend.data._M_elems[2] = 0;
              result_2.m_backend.data._M_elems[3] = 0;
              result_2.m_backend.data._M_elems[4] = 0;
              result_2.m_backend.data._M_elems[5] = 0;
              result_2.m_backend.data._M_elems[6] = 0;
              result_2.m_backend.data._M_elems[7] = 0;
              result_2.m_backend.data._M_elems[8] = 0;
              result_2.m_backend.data._M_elems[9] = 0;
              result_2.m_backend.data._M_elems[10] = 0;
              result_2.m_backend.data._M_elems[0xb] = 0;
              result_2.m_backend.data._M_elems[0xc] = 0;
              result_2.m_backend.data._M_elems[0xd] = 0;
              result_2.m_backend.data._M_elems[0xe] = 0;
              result_2.m_backend.data._M_elems[0xf] = 0;
              result_2.m_backend.data._M_elems[0x10] = 0;
              result_2.m_backend.data._M_elems[0x11] = 0;
              result_2.m_backend.data._M_elems[0x12] = 0;
              result_2.m_backend.data._M_elems[0x13] = 0;
              result_2.m_backend.data._M_elems[0x14] = 0;
              result_2.m_backend.data._M_elems[0x15] = 0;
              result_2.m_backend.data._M_elems[0x16] = 0;
              result_2.m_backend.data._M_elems[0x17] = 0;
              result_2.m_backend.data._M_elems[0x18] = 0;
              result_2.m_backend.data._M_elems[0x19] = 0;
              result_2.m_backend.data._M_elems._104_5_ = 0;
              result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_2.m_backend.exp = 0;
              result_2.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_2.m_backend,&local_238,&pnVar29->m_backend);
              pcVar21 = &result_2.m_backend;
            }
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.neg = false;
            result.m_backend.exp = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (pcVar28,pcVar21,&local_3f8);
            pcVar21 = &local_3f8;
            for (; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pcVar21->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4);
            }
LAB_0045094c:
            lVar15 = 0x1c;
            local_3f8.exp = result.m_backend.exp;
            local_3f8.neg = result.m_backend.neg;
            local_3f8._120_8_ = result.m_backend._120_8_;
            tVar10 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_3f8,&local_b0);
            if (tVar10) {
              pcVar28 = &local_3f8;
              pnVar23 = &local_b0;
              for (; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pnVar23->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar23 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_b0.m_backend.exp = local_3f8.exp;
              local_b0.m_backend.neg = local_3f8.neg;
              local_b0.m_backend.fpclass = local_3f8.fpclass;
              local_b0.m_backend.prec_elem = local_3f8.prec_elem;
              local_428 = iVar2;
            }
          }
        }
        else {
          for (; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar28->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
            pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar23 + (ulong)bVar35 * -8 + 4);
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          }
          result.m_backend.exp = (this->epsilon).m_backend.exp;
          result.m_backend.neg = (this->epsilon).m_backend.neg;
          result.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
          result.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
          if (result.m_backend.fpclass != cpp_dec_float_finite ||
              result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
          }
          tVar10 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_3f8,&result);
          pnVar19 = local_360;
          if (tVar10) {
            pcVar28 = &local_3f8;
            pnVar23 = &result;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pnVar23->m_backend).data._M_elems[0] =
                   (((cpp_dec_float<200U,_int,_void> *)&pcVar28->data)->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
              pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar23 + ((ulong)bVar35 * -2 + 1) * 4);
            }
            result.m_backend.exp = local_3f8.exp;
            result.m_backend.neg = local_3f8.neg;
            result.m_backend.fpclass = local_3f8.fpclass;
            result.m_backend.prec_elem = local_3f8.prec_elem;
            puVar25 = local_2c0.data._M_elems + 1;
            if (local_3f8.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
            {
              result.m_backend.neg = (bool)(local_3f8.neg ^ 1);
            }
            tVar10 = boost::multiprecision::operator>
                               (&result,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_2c0);
            if (tVar10) {
              puVar26 = local_3f8.data._M_elems + 1;
              pnVar23 = &result_2;
              for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pnVar23->m_backend).data._M_elems[0] = *puVar26;
                puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
                pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar23 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_2c0.data._M_elems[0] = 0;
              iVar11 = local_3f8.exp;
              iVar3 = local_3f8.prec_elem;
              if (local_3f8.fpclass == cpp_dec_float_finite && local_3f8.data._M_elems[0] == 0) {
                bVar18 = local_3f8.neg;
                fVar31 = cpp_dec_float_finite;
              }
              else {
                bVar18 = local_3f8.neg ^ 1;
                local_2c0.data._M_elems[0] = local_3f8.data._M_elems[0];
                fVar31 = local_3f8.fpclass;
              }
            }
            else {
              puVar26 = puVar25;
              pnVar23 = &result_2;
              for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pnVar23->m_backend).data._M_elems[0] = *puVar26;
                puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
                pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar23 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              iVar11 = local_2c0.exp;
              bVar18 = local_2c0.neg;
              iVar3 = local_2c0.prec_elem;
              fVar31 = local_2c0.fpclass;
            }
            pnVar23 = &result_2;
            for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar25 = (pnVar23->m_backend).data._M_elems[0];
              pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar23 + ((ulong)bVar35 * -2 + 1) * 4);
              puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
            }
            local_2c0.prec_elem = iVar3;
            local_2c0.fpclass = fVar31;
            pnVar22 = (pointer)((long)local_368 + (long)iVar2 * 0x80);
            pcVar28 = &local_1b8;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pcVar28->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
              pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
            }
            local_1b8.exp = (((pointer)((long)local_368 + (long)iVar2 * 0x80))->m_backend).exp;
            local_1b8.neg = (((pointer)((long)local_368 + (long)iVar2 * 0x80))->m_backend).neg;
            local_1b8.fpclass =
                 (((pointer)((long)local_368 + (long)iVar2 * 0x80))->m_backend).fpclass;
            local_1b8.prec_elem =
                 (((pointer)((long)local_368 + (long)iVar2 * 0x80))->m_backend).prec_elem;
            local_2c0.exp = iVar11;
            local_2c0.neg = (bool)bVar18;
            pdVar13 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,-*pdVar13,(type *)0x0);
            tVar10 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_1b8,
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&result.m_backend);
            if (tVar10) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&local_1b8,&local_370[iVar2].m_backend);
              lVar15 = 0x1c;
              pcVar28 = &result.m_backend;
              pcVar21 = &local_238;
              for (lVar14 = lVar15; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar21->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4)
                ;
              }
              local_238.exp = result.m_backend.exp;
              local_238.neg = result.m_backend.neg;
              local_238.fpclass = result.m_backend.fpclass;
              local_238.prec_elem = result.m_backend.prec_elem;
              result.m_backend.data._M_elems._0_8_ =
                   result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
              tVar10 = boost::multiprecision::operator>=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_238,(int *)&result.m_backend);
              if (tVar10) {
                pnVar23 = pnVar29;
                pnVar27 = &result_2;
                for (lVar14 = lVar15; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pnVar27->m_backend).data._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
                  pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar23 + (ulong)bVar35 * -8 + 4);
                  pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar27 + ((ulong)bVar35 * -2 + 1) * 4);
                }
                result_2.m_backend.exp = (this->fastDelta).m_backend.exp;
                result_2.m_backend.neg = (this->fastDelta).m_backend.neg;
                result_2.m_backend.fpclass = (this->fastDelta).m_backend.fpclass;
                result_2.m_backend.prec_elem = (this->fastDelta).m_backend.prec_elem;
                if (result_2.m_backend.fpclass != cpp_dec_float_finite ||
                    result_2.m_backend.data._M_elems[0] != 0) {
                  result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
                }
              }
              else {
                result_2.m_backend.fpclass = cpp_dec_float_finite;
                result_2.m_backend.prec_elem = 0x1c;
                result_2.m_backend.data._M_elems[0] = 0;
                result_2.m_backend.data._M_elems[1] = 0;
                result_2.m_backend.data._M_elems[2] = 0;
                result_2.m_backend.data._M_elems[3] = 0;
                result_2.m_backend.data._M_elems[4] = 0;
                result_2.m_backend.data._M_elems[5] = 0;
                result_2.m_backend.data._M_elems[6] = 0;
                result_2.m_backend.data._M_elems[7] = 0;
                result_2.m_backend.data._M_elems[8] = 0;
                result_2.m_backend.data._M_elems[9] = 0;
                result_2.m_backend.data._M_elems[10] = 0;
                result_2.m_backend.data._M_elems[0xb] = 0;
                result_2.m_backend.data._M_elems[0xc] = 0;
                result_2.m_backend.data._M_elems[0xd] = 0;
                result_2.m_backend.data._M_elems[0xe] = 0;
                result_2.m_backend.data._M_elems[0xf] = 0;
                result_2.m_backend.data._M_elems[0x10] = 0;
                result_2.m_backend.data._M_elems[0x11] = 0;
                result_2.m_backend.data._M_elems[0x12] = 0;
                result_2.m_backend.data._M_elems[0x13] = 0;
                result_2.m_backend.data._M_elems[0x14] = 0;
                result_2.m_backend.data._M_elems[0x15] = 0;
                result_2.m_backend.data._M_elems[0x16] = 0;
                result_2.m_backend.data._M_elems[0x17] = 0;
                result_2.m_backend.data._M_elems[0x18] = 0;
                result_2.m_backend.data._M_elems[0x19] = 0;
                result_2.m_backend.data._M_elems._104_5_ = 0;
                result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_2.m_backend.exp = 0;
                result_2.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result_2.m_backend,&local_238,&pnVar29->m_backend);
              }
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.neg = false;
              result.m_backend.exp = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&result_2.m_backend,&local_3f8);
              pcVar28 = &result.m_backend;
              pcVar21 = &local_3f8;
              for (; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar21->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4)
                ;
              }
              goto LAB_0045094c;
            }
          }
        }
      }
LAB_004509b8:
    }
  }
  else {
    local_428 = -1;
    (update->thedelta).setupStatus = false;
    pnVar7 = (update->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pnVar29 = &this->epsilon;
    pnVar23 = &this->fastDelta;
    local_368 = &(((pointer)local_368)->m_backend).fpclass;
    lVar15 = 0;
    local_410 = 0;
    local_4b8 = 0;
    while( true ) {
      pnVar9 = local_360;
      this_00 = (cpp_dec_float<200u,int,void> *)((long)&(local_360->m_backend).data + lVar15);
      if ((cpp_dec_float<200u,int,void> *)
          (pnVar19 + (int)((ulong)((long)pnVar7 - (long)pnVar22) >> 7)) <= this_00) break;
      lVar14 = 0x1c;
      pcVar24 = this_00;
      pcVar28 = &local_3f8;
      for (lVar16 = lVar14; lVar16 != 0; lVar16 = lVar16 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar28->data)->data)._M_elems[0] = *(uint *)pcVar24;
        pcVar24 = pcVar24 + (ulong)bVar35 * -8 + 4;
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
      }
      local_3f8.exp = *(int *)((long)&(pnVar9->m_backend).data + lVar15 + 0x70);
      local_3f8.neg = *(bool *)((long)&(pnVar9->m_backend).data + lVar15 + 0x74);
      local_3f8._120_8_ = *(ulong *)((long)&(pnVar9->m_backend).data + lVar15 + 0x78);
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      tVar10 = boost::multiprecision::operator!=
                         ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_3f8,(double *)&result);
      pnVar27 = pnVar29;
      pnVar30 = &result;
      piVar33 = piVar32;
      if (tVar10) {
        for (; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar30->m_backend).data._M_elems[0] = (pnVar27->m_backend).data._M_elems[0];
          pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar27 + (ulong)bVar35 * -8 + 4);
          pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar30 + ((ulong)bVar35 * -2 + 1) * 4);
        }
        result.m_backend.exp = (this->epsilon).m_backend.exp;
        result.m_backend.neg = (this->epsilon).m_backend.neg;
        result.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
        if (result.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
        }
        tVar10 = boost::multiprecision::operator>=
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_3f8,&result);
        if (tVar10) {
          pnVar27 = pnVar29;
          pnVar30 = &result_2;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pnVar30->m_backend).data._M_elems[0] = (pnVar27->m_backend).data._M_elems[0];
            pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar27 + (ulong)bVar35 * -8 + 4);
            pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar30 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          result_2.m_backend.exp = (this->epsilon).m_backend.exp;
          result_2.m_backend.neg = (this->epsilon).m_backend.neg;
          result_2.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
          result_2.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
          tVar10 = boost::multiprecision::operator<=
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_3f8,&result_2);
          if (tVar10) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(this_00,0.0);
            goto LAB_00450fcd;
          }
        }
        piVar33 = piVar32 + 1;
        *piVar32 = (int)local_4b8;
        if (TVar1 == LEAVE) {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          if (this->iscoid == true) {
            pDVar17 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat;
          }
          else {
            pDVar17 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat;
          }
          if (0 < pSVar5->theRep * pDVar17->data[local_4b8]) goto LAB_00450fcd;
        }
        if (bVar34) {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar6 = (pSVar5->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < *(int *)((long)&(pSVar6->super_DataKey).info + local_410)) {
            SPxColId::SPxColId((SPxColId *)&result,
                               (SPxId *)((long)&(pSVar6->super_DataKey).info + local_410));
            iVar12 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)&result);
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar12] == P_FIXED) goto LAB_00450fcd;
          }
        }
        pfVar8 = local_368;
        pnVar27 = pnVar29;
        pcVar28 = &result.m_backend;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar28->data)._M_elems[0] = (pnVar27->m_backend).data._M_elems[0];
          pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar27 + (ulong)bVar35 * -8 + 4);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        }
        result.m_backend.exp = (this->epsilon).m_backend.exp;
        result.m_backend.neg = (this->epsilon).m_backend.neg;
        result.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
        tVar10 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_3f8,
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&result.m_backend);
        if (tVar10) {
          tVar10 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_3f8,
                              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_2c0);
          pcVar28 = &local_2c0;
          if (tVar10) {
            pcVar28 = &local_3f8;
          }
          lVar14 = 0x1c;
          pcVar21 = &local_2c0;
          for (lVar16 = lVar14; lVar16 != 0; lVar16 = lVar16 + -1) {
            (((cpp_dec_float<200U,_int,_void> *)&pcVar21->data)->data)._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar28->data)->data)._M_elems[0];
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar21 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          pcVar28 = &local_2c0;
          if (tVar10) {
            pcVar28 = &local_3f8;
          }
          local_2c0.exp = pcVar28->exp;
          pcVar28 = &local_2c0;
          if (tVar10) {
            pcVar28 = &local_3f8;
          }
          local_2c0.neg = pcVar28->neg;
          uVar36 = CONCAT44((int)((uint)tVar10 << 0x1f) >> 0x1f,(int)((uint)tVar10 << 0x1f) >> 0x1f)
          ;
          local_2c0._120_8_ = ~uVar36 & local_2c0._120_8_ | local_3f8._120_8_ & uVar36;
          puVar25 = (uint *)((long)&(pnVar4->m_backend).data + lVar15);
          puVar26 = puVar25;
          pcVar28 = &local_138;
          for (lVar16 = lVar14; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pcVar28->data)._M_elems[0] = *puVar26;
            puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          }
          local_138.exp = puVar25[0x1c];
          local_138.neg = SUB41(puVar25[0x1d],0);
          local_138.fpclass = puVar25[0x1e];
          local_138.prec_elem = puVar25[0x1f];
          pdVar13 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,*pdVar13,(type *)0x0);
          tVar10 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_138,
                              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&result.m_backend);
          if (tVar10) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,&local_138,
                       (cpp_dec_float<200U,_int,_void> *)((long)&local_370->m_backend + lVar15));
            pcVar28 = &result.m_backend;
            pcVar21 = &local_238;
            for (; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar21->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4);
            }
            local_238.exp = result.m_backend.exp;
            local_238.neg = result.m_backend.neg;
            local_238.fpclass = result.m_backend.fpclass;
            local_238.prec_elem = result.m_backend.prec_elem;
            result.m_backend.data._M_elems._0_8_ =
                 result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar10 = boost::multiprecision::operator<=
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_238,(int *)&result.m_backend);
            if (tVar10) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&pnVar23->m_backend,&local_3f8);
            }
            else {
              result_2.m_backend.fpclass = cpp_dec_float_finite;
              result_2.m_backend.prec_elem = 0x1c;
              result_2.m_backend.data._M_elems[0] = 0;
              result_2.m_backend.data._M_elems[1] = 0;
              result_2.m_backend.data._M_elems[2] = 0;
              result_2.m_backend.data._M_elems[3] = 0;
              result_2.m_backend.data._M_elems[4] = 0;
              result_2.m_backend.data._M_elems[5] = 0;
              result_2.m_backend.data._M_elems[6] = 0;
              result_2.m_backend.data._M_elems[7] = 0;
              result_2.m_backend.data._M_elems[8] = 0;
              result_2.m_backend.data._M_elems[9] = 0;
              result_2.m_backend.data._M_elems[10] = 0;
              result_2.m_backend.data._M_elems[0xb] = 0;
              result_2.m_backend.data._M_elems[0xc] = 0;
              result_2.m_backend.data._M_elems[0xd] = 0;
              result_2.m_backend.data._M_elems[0xe] = 0;
              result_2.m_backend.data._M_elems[0xf] = 0;
              result_2.m_backend.data._M_elems[0x10] = 0;
              result_2.m_backend.data._M_elems[0x11] = 0;
              result_2.m_backend.data._M_elems[0x12] = 0;
              result_2.m_backend.data._M_elems[0x13] = 0;
              result_2.m_backend.data._M_elems[0x14] = 0;
              result_2.m_backend.data._M_elems[0x15] = 0;
              result_2.m_backend.data._M_elems[0x16] = 0;
              result_2.m_backend.data._M_elems[0x17] = 0;
              result_2.m_backend.data._M_elems[0x18] = 0;
              result_2.m_backend.data._M_elems[0x19] = 0;
              result_2.m_backend.data._M_elems._104_5_ = 0;
              result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_2.m_backend.exp = 0;
              result_2.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_2.m_backend,&local_238,&pnVar23->m_backend);
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&result_2.m_backend,&local_3f8);
            }
            pcVar28 = &result.m_backend;
            pcVar21 = &local_3f8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar21->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4);
            }
            local_3f8.exp = result.m_backend.exp;
            local_3f8.neg = result.m_backend.neg;
            local_3f8.fpclass = result.m_backend.fpclass;
            local_3f8.prec_elem = result.m_backend.prec_elem;
LAB_004510d8:
            result.m_backend.exp = local_3f8.exp;
            result.m_backend.neg = local_3f8.neg;
            result.m_backend._120_8_ = local_3f8._120_8_;
            tVar10 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_3f8,&local_b0);
            if (tVar10) {
              pcVar28 = &local_3f8;
              pnVar27 = &local_b0;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_b0.m_backend.exp = local_3f8.exp;
              local_b0.m_backend.neg = local_3f8.neg;
              local_b0.m_backend.fpclass = local_3f8.fpclass;
              local_b0.m_backend.prec_elem = local_3f8.prec_elem;
              local_428 = (int)local_4b8;
            }
          }
        }
        else {
          pnVar27 = pnVar29;
          pcVar28 = &result.m_backend;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar28->data)._M_elems[0] = (pnVar27->m_backend).data._M_elems[0];
            pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar27 + (ulong)bVar35 * -8 + 4);
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          }
          result.m_backend.exp = (this->epsilon).m_backend.exp;
          result.m_backend.neg = (this->epsilon).m_backend.neg;
          result.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
          result.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
          if (result.m_backend.fpclass != cpp_dec_float_finite ||
              result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
          }
          tVar10 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_3f8,
                              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&result.m_backend);
          if (tVar10) {
            pcVar28 = &local_3f8;
            pcVar21 = &result.m_backend;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar21->data)._M_elems[0] =
                   (((cpp_dec_float<200U,_int,_void> *)&pcVar28->data)->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4);
            }
            result.m_backend.exp = local_3f8.exp;
            result.m_backend.neg = local_3f8.neg;
            result.m_backend.fpclass = local_3f8.fpclass;
            result.m_backend.prec_elem = local_3f8.prec_elem;
            if (local_3f8.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
            {
              result.m_backend.neg = (bool)(local_3f8.neg ^ 1);
            }
            tVar10 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&result.m_backend,
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_2c0);
            lVar14 = 0x1b;
            if (tVar10) {
              puVar25 = local_3f8.data._M_elems + 1;
              pnVar27 = &result_2;
              for (lVar16 = lVar14; lVar16 != 0; lVar16 = lVar16 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = *puVar25;
                puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_2c0.data._M_elems[0] = 0;
              iVar12 = local_3f8.exp;
              iVar3 = local_3f8.prec_elem;
              if (local_3f8.fpclass == cpp_dec_float_finite && local_3f8.data._M_elems[0] == 0) {
                bVar18 = local_3f8.neg;
                fVar31 = cpp_dec_float_finite;
              }
              else {
                bVar18 = local_3f8.neg ^ 1;
                local_2c0.data._M_elems[0] = local_3f8.data._M_elems[0];
                fVar31 = local_3f8.fpclass;
              }
            }
            else {
              puVar25 = local_2c0.data._M_elems + 1;
              pnVar27 = &result_2;
              for (lVar16 = lVar14; lVar16 != 0; lVar16 = lVar16 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = *puVar25;
                puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
                pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar27 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              iVar12 = local_2c0.exp;
              iVar3 = local_2c0.prec_elem;
              bVar18 = local_2c0.neg;
              fVar31 = local_2c0.fpclass;
            }
            pnVar27 = &result_2;
            puVar25 = local_2c0.data._M_elems + 1;
            for (; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar25 = (pnVar27->m_backend).data._M_elems[0];
              pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar27 + ((ulong)bVar35 * -2 + 1) * 4);
              puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
            }
            local_2c0.prec_elem = iVar3;
            local_2c0.fpclass = fVar31;
            puVar25 = (uint *)((long)pfVar8 + lVar15 + -0x78);
            lVar14 = 0x1c;
            puVar26 = puVar25;
            pcVar28 = &local_1b8;
            for (lVar16 = lVar14; lVar16 != 0; lVar16 = lVar16 + -1) {
              (pcVar28->data)._M_elems[0] = *puVar26;
              puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
            }
            local_1b8.exp = puVar25[0x1c];
            local_1b8.neg = SUB41(puVar25[0x1d],0);
            local_1b8.fpclass = puVar25[0x1e];
            local_1b8.prec_elem = puVar25[0x1f];
            local_2c0.exp = iVar12;
            local_2c0.neg = (bool)bVar18;
            pdVar13 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,-*pdVar13,(type *)0x0);
            tVar10 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_1b8,
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&result.m_backend);
            if (tVar10) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&local_1b8,
                         (cpp_dec_float<200U,_int,_void> *)((long)&local_370->m_backend + lVar15));
              pcVar28 = &result.m_backend;
              pcVar21 = &local_238;
              for (; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar21->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar35 * -8 + 4)
                ;
              }
              local_238.exp = result.m_backend.exp;
              local_238.neg = result.m_backend.neg;
              local_238.fpclass = result.m_backend.fpclass;
              local_238.prec_elem = result.m_backend.prec_elem;
              result.m_backend.data._M_elems._0_8_ =
                   result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
              tVar10 = boost::multiprecision::operator>=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_238,(int *)&result.m_backend);
              if (tVar10) {
                pnVar27 = pnVar23;
                pcVar28 = &result_2.m_backend;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar28->data)._M_elems[0] = (pnVar27->m_backend).data._M_elems[0];
                  pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar27 + (ulong)bVar35 * -8 + 4);
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                }
                result_2.m_backend.exp = (this->fastDelta).m_backend.exp;
                result_2.m_backend.neg = (this->fastDelta).m_backend.neg;
                result_2.m_backend.fpclass = (this->fastDelta).m_backend.fpclass;
                result_2.m_backend.prec_elem = (this->fastDelta).m_backend.prec_elem;
                if (result_2.m_backend.fpclass != cpp_dec_float_finite ||
                    result_2.m_backend.data._M_elems[0] != 0) {
                  result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
                }
                result.m_backend.fpclass = cpp_dec_float_finite;
                result.m_backend.prec_elem = 0x1c;
                result.m_backend.data._M_elems[0] = 0;
                result.m_backend.data._M_elems[1] = 0;
                result.m_backend.data._M_elems[2] = 0;
                result.m_backend.data._M_elems[3] = 0;
                result.m_backend.data._M_elems[4] = 0;
                result.m_backend.data._M_elems[5] = 0;
                result.m_backend.data._M_elems[6] = 0;
                result.m_backend.data._M_elems[7] = 0;
                result.m_backend.data._M_elems[8] = 0;
                result.m_backend.data._M_elems[9] = 0;
                result.m_backend.data._M_elems[10] = 0;
                result.m_backend.data._M_elems[0xb] = 0;
                result.m_backend.data._M_elems[0xc] = 0;
                result.m_backend.data._M_elems[0xd] = 0;
                result.m_backend.data._M_elems[0xe] = 0;
                result.m_backend.data._M_elems[0xf] = 0;
                result.m_backend.data._M_elems[0x10] = 0;
                result.m_backend.data._M_elems[0x11] = 0;
                result.m_backend.data._M_elems[0x12] = 0;
                result.m_backend.data._M_elems[0x13] = 0;
                result.m_backend.data._M_elems[0x14] = 0;
                result.m_backend.data._M_elems[0x15] = 0;
                result.m_backend.data._M_elems[0x16] = 0;
                result.m_backend.data._M_elems[0x17] = 0;
                result.m_backend.data._M_elems[0x18] = 0;
                result.m_backend.data._M_elems[0x19] = 0;
                result.m_backend.data._M_elems._104_5_ = 0;
                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result.m_backend.exp = 0;
                result.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result.m_backend,&result_2.m_backend,&local_3f8);
                pcVar28 = &result.m_backend;
                pcVar21 = &local_3f8;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar21->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar21 + (ulong)bVar35 * -8 + 4);
                }
                local_3f8.exp = result.m_backend.exp;
                local_3f8.neg = result.m_backend.neg;
                local_3f8.fpclass = result.m_backend.fpclass;
                local_3f8.prec_elem = result.m_backend.prec_elem;
              }
              else {
                result_2.m_backend.fpclass = cpp_dec_float_finite;
                result_2.m_backend.prec_elem = 0x1c;
                result_2.m_backend.data._M_elems[0] = 0;
                result_2.m_backend.data._M_elems[1] = 0;
                result_2.m_backend.data._M_elems[2] = 0;
                result_2.m_backend.data._M_elems[3] = 0;
                result_2.m_backend.data._M_elems[4] = 0;
                result_2.m_backend.data._M_elems[5] = 0;
                result_2.m_backend.data._M_elems[6] = 0;
                result_2.m_backend.data._M_elems[7] = 0;
                result_2.m_backend.data._M_elems[8] = 0;
                result_2.m_backend.data._M_elems[9] = 0;
                result_2.m_backend.data._M_elems[10] = 0;
                result_2.m_backend.data._M_elems[0xb] = 0;
                result_2.m_backend.data._M_elems[0xc] = 0;
                result_2.m_backend.data._M_elems[0xd] = 0;
                result_2.m_backend.data._M_elems[0xe] = 0;
                result_2.m_backend.data._M_elems[0xf] = 0;
                result_2.m_backend.data._M_elems[0x10] = 0;
                result_2.m_backend.data._M_elems[0x11] = 0;
                result_2.m_backend.data._M_elems[0x12] = 0;
                result_2.m_backend.data._M_elems[0x13] = 0;
                result_2.m_backend.data._M_elems[0x14] = 0;
                result_2.m_backend.data._M_elems[0x15] = 0;
                result_2.m_backend.data._M_elems[0x16] = 0;
                result_2.m_backend.data._M_elems[0x17] = 0;
                result_2.m_backend.data._M_elems[0x18] = 0;
                result_2.m_backend.data._M_elems[0x19] = 0;
                result_2.m_backend.data._M_elems._104_5_ = 0;
                result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_2.m_backend.exp = 0;
                result_2.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result_2.m_backend,&local_238,&pnVar23->m_backend);
                result.m_backend.fpclass = cpp_dec_float_finite;
                result.m_backend.prec_elem = 0x1c;
                result.m_backend.data._M_elems[0] = 0;
                result.m_backend.data._M_elems[1] = 0;
                result.m_backend.data._M_elems[2] = 0;
                result.m_backend.data._M_elems[3] = 0;
                result.m_backend.data._M_elems[4] = 0;
                result.m_backend.data._M_elems[5] = 0;
                result.m_backend.data._M_elems[6] = 0;
                result.m_backend.data._M_elems[7] = 0;
                result.m_backend.data._M_elems[8] = 0;
                result.m_backend.data._M_elems[9] = 0;
                result.m_backend.data._M_elems[10] = 0;
                result.m_backend.data._M_elems[0xb] = 0;
                result.m_backend.data._M_elems[0xc] = 0;
                result.m_backend.data._M_elems[0xd] = 0;
                result.m_backend.data._M_elems[0xe] = 0;
                result.m_backend.data._M_elems[0xf] = 0;
                result.m_backend.data._M_elems[0x10] = 0;
                result.m_backend.data._M_elems[0x11] = 0;
                result.m_backend.data._M_elems[0x12] = 0;
                result.m_backend.data._M_elems[0x13] = 0;
                result.m_backend.data._M_elems[0x14] = 0;
                result.m_backend.data._M_elems[0x15] = 0;
                result.m_backend.data._M_elems[0x16] = 0;
                result.m_backend.data._M_elems[0x17] = 0;
                result.m_backend.data._M_elems[0x18] = 0;
                result.m_backend.data._M_elems[0x19] = 0;
                result.m_backend.data._M_elems._104_5_ = 0;
                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result.m_backend.exp = 0;
                result.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result.m_backend,&result_2.m_backend,&local_3f8);
                pcVar28 = &result.m_backend;
                pcVar21 = &local_3f8;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar21->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar21 + (ulong)bVar35 * -8 + 4);
                }
                local_3f8.exp = result.m_backend.exp;
                local_3f8.neg = result.m_backend.neg;
                local_3f8.fpclass = result.m_backend.fpclass;
                local_3f8.prec_elem = result.m_backend.prec_elem;
              }
              goto LAB_004510d8;
            }
          }
        }
      }
LAB_00450fcd:
      local_4b8 = local_4b8 + 1;
      local_410 = local_410 + 8;
      lVar15 = lVar15 + 0x80;
      piVar32 = piVar33;
    }
    (update->thedelta).super_IdxSet.num =
         (int)((ulong)((long)piVar32 - (long)(update->thedelta).super_IdxSet.idx) >> 2);
    (update->thedelta).setupStatus = true;
  }
  lVar15 = 0x1c;
  pnVar29 = &local_b0;
  pnVar23 = val;
  for (lVar14 = lVar15; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pnVar23->m_backend).data._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
    pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
    pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar23 + ((ulong)bVar35 * -2 + 1) * 4);
  }
  (val->m_backend).exp = local_b0.m_backend.exp;
  (val->m_backend).neg = local_b0.m_backend.neg;
  (val->m_backend).fpclass = local_b0.m_backend.fpclass;
  (val->m_backend).prec_elem = local_b0.m_backend.prec_elem;
  pcVar28 = &local_2c0;
  pnVar29 = local_240;
  for (; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pnVar29->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
    pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
    pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
  }
  (local_240->m_backend).exp = local_2c0.exp;
  (local_240->m_backend).neg = local_2c0.neg;
  (local_240->m_backend).fpclass = local_2c0.fpclass;
  (local_240->m_backend).prec_elem = local_2c0.prec_elem;
  return local_428;
}

Assistant:

int SPxFastRT<R>::maxDelta(
   R& val,                                /* on return: maximum step length */
   R& maxabs,                             /* on return: maximum absolute value in upd VectorBase<R> */
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         x = upd[i];

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse Vector update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;

            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;
   return sel;
}